

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O2

BitMatrix *
ZXing::Pdf417::BitMatrixFromBitArray
          (BitMatrix *__return_storage_ptr__,
          vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          *input,int margin)

{
  pointer pvVar1;
  int iVar2;
  const_reference cVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int x;
  size_type __n;
  int y;
  
  pvVar1 = (input->
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (*(int *)&(((_Bit_iterator *)
                     ((long)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p -
          *(int *)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data) * 8 +
          *(uint *)((long)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data + 0x18);
  uVar4 = ((long)(input->
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x28;
  iVar2 = (int)uVar4;
  BitMatrix::BitMatrix(__return_storage_ptr__,uVar6 + margin * 2,iVar2 + margin * 2);
  y = ~margin + __return_storage_ptr__->_height;
  uVar5 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar5;
  }
  uVar4 = uVar4 & 0xffffffff;
  if (iVar2 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    for (__n = 0; uVar7 != __n; __n = __n + 1) {
      cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((input->
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar5,__n);
      if (cVar3) {
        BitMatrix::set(__return_storage_ptr__,margin + (int)__n,y,true);
      }
    }
    y = y + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

static BitMatrix BitMatrixFromBitArray(const std::vector<std::vector<bool>>& input, int margin)
{
	// Creates the bitmatrix with extra space for whitespace
	int width = Size(input[0]);
	int height = Size(input);
	BitMatrix result(width + 2 * margin, height + 2 * margin);
	for (int y = 0, yOutput = static_cast<int>(result.height()) - margin - 1; y < height; y++, yOutput--) {
		for (int x = 0; x < width; ++x) {
			// Zero is white in the bytematrix
			if (input[y][x]) {
				result.set(x + margin, yOutput);
			}
		}
	}
	return result;
}